

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void llvm::logAllUnhandledErrors(Error *E,raw_ostream *OS,Twine ErrorBanner)

{
  bool bVar1;
  anon_class_8_1_3fcf62a2 local_28;
  Error local_20;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  Error *E_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)E;
  bVar1 = Error::operator_cast_to_bool(E);
  if (bVar1) {
    operator<<(local_18,&ErrorBanner);
    Error::Error(&local_20,E);
    local_28.OS = local_18;
    handleAllErrors<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
              (&local_20,&local_28);
    Error::~Error(&local_20);
  }
  return;
}

Assistant:

void logAllUnhandledErrors(Error E, raw_ostream &OS, Twine ErrorBanner) {
  if (!E)
    return;
  OS << ErrorBanner;
  handleAllErrors(std::move(E), [&](const ErrorInfoBase &EI) {
    EI.log(OS);
    OS << "\n";
  });
}